

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptr.h
# Opt level: O2

void __thiscall
ut::shared_ptr<ut::test_case_impl<agge::tests::LayoutTests>,_unsigned_int>::reset
          (shared_ptr<ut::test_case_impl<agge::tests::LayoutTests>,_unsigned_int> *this)

{
  test_case_impl<agge::tests::LayoutTests> *ptVar1;
  uint *puVar2;
  
  puVar2 = this->_refcount;
  if ((puVar2 != (uint *)0x0) && (*puVar2 = *puVar2 - 1, *puVar2 == 0)) {
    ptVar1 = this->_ptr;
    if (ptVar1 != (test_case_impl<agge::tests::LayoutTests> *)0x0) {
      (*(ptVar1->super_test_case).super_destructible._vptr_destructible[1])(ptVar1);
      puVar2 = this->_refcount;
    }
    operator_delete(puVar2);
  }
  this->_ptr = (test_case_impl<agge::tests::LayoutTests> *)0x0;
  this->_refcount = (uint *)0x0;
  return;
}

Assistant:

inline void shared_ptr<T, CounterT>::reset() throw()
	{
		enum {	unused = sizeof(T)	};
		if (_refcount && !--*_refcount)
			delete _ptr, delete _refcount;
		_ptr = 0, _refcount = 0;
	}